

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNamesDedupOnOptimizedCases_Test::TestBody
          (DescriptorTest_FieldNamesDedupOnOptimizedCases_Test *this)

{
  FieldDescriptor *pFVar1;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  char *pcVar2;
  AssertHelper local_50;
  char *local_48;
  AssertionResult gtest_ar;
  btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  local_30;
  
  local_50.data_ = (AssertHelperData *)0xd5f9ac;
  local_48 = "fieldName1";
  pFVar1 = Descriptor::field((this->super_DescriptorTest).message4_,0);
  TestBody::anon_class_1_0_00000001::operator()
            ((btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_30,(anon_class_1_0_00000001 *)pFVar1,field);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(&gtest_ar,(char *)&local_50,
               (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"collect_unique_names(message4_->field(0))");
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  ::~btree(&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3cf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_30.root_ != (node_type *)0x0) {
      (**(code **)(*(long *)local_30.root_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_50.data_ = (AssertHelperData *)0xd5f9e2;
  pFVar1 = Descriptor::field((this->super_DescriptorTest).message4_,6);
  TestBody::anon_class_1_0_00000001::operator()
            ((btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_30,(anon_class_1_0_00000001 *)pFVar1,field_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*>>>::
  operator()(&gtest_ar,(char *)&local_50,
             (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)"collect_unique_names(message4_->field(6))");
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  ::~btree(&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3d2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_30.root_ != (node_type *)0x0) {
      (**(code **)(*(long *)local_30.root_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldNamesDedupOnOptimizedCases) {
  const auto collect_unique_names = [](const FieldDescriptor* field) {
    absl::btree_set<absl::string_view> names{
        field->name(), field->lowercase_name(), field->camelcase_name(),
        field->json_name()};
    // For names following the style guide, verify that we have the same number
    // of string objects as we have string values. That is, duplicate names use
    // the same std::string object. This is for memory efficiency.
    EXPECT_EQ(names.size(),
              (absl::flat_hash_set<const void*>{
                  field->name().data(), field->lowercase_name().data(),
                  field->camelcase_name().data(), field->json_name().data()}
                   .size()))
        << testing::PrintToString(names);
    return names;
  };

  // field_name1
  EXPECT_THAT(collect_unique_names(message4_->field(0)),
              ElementsAre("fieldName1", "field_name1"));
  // fieldname7
  EXPECT_THAT(collect_unique_names(message4_->field(6)),
              ElementsAre("fieldname7"));
}